

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfDynamicInfo.cpp
# Opt level: O1

DynamicList * __thiscall
libelfxx::ElfDynamicInfo::find
          (DynamicList *__return_storage_ptr__,ElfDynamicInfo *this,uint64_t tag)

{
  pointer *ppEVar1;
  _Base_ptr p_Var2;
  iterator __position;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_node_base *p_Var5;
  const_iterator itr;
  _Rb_tree_node_base *p_Var6;
  
  p_Var5 = &(this->_dyns)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var4 = (this->_dyns)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = p_Var5;
  for (p_Var2 = p_Var4; p_Var2 != (_Rb_tree_node_base *)0x0;
      p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) <= tag]) {
    if (tag < *(ulong *)(p_Var2 + 1)) {
      p_Var6 = p_Var2;
    }
  }
  for (; p_Var4 != (_Rb_tree_node_base *)0x0;
      p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < tag]) {
    if (*(ulong *)(p_Var4 + 1) >= tag) {
      p_Var5 = p_Var4;
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<libelfxx::ElfDynamic,_std::allocator<libelfxx::ElfDynamic>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libelfxx::ElfDynamic,_std::allocator<libelfxx::ElfDynamic>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libelfxx::ElfDynamic,_std::allocator<libelfxx::ElfDynamic>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (; p_Var5 != p_Var6; p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    p_Var2 = p_Var5[1]._M_parent;
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<libelfxx::ElfDynamic,_std::allocator<libelfxx::ElfDynamic>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<libelfxx::ElfDynamic,_std::allocator<libelfxx::ElfDynamic>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<libelfxx::ElfDynamic,std::allocator<libelfxx::ElfDynamic>>::
      _M_realloc_insert<libelfxx::ElfDynamic_const&>
                ((vector<libelfxx::ElfDynamic,std::allocator<libelfxx::ElfDynamic>> *)
                 __return_storage_ptr__,__position,(ElfDynamic *)p_Var2);
    }
    else {
      p_Var3 = p_Var2->_M_parent;
      (__position._M_current)->_tag = *(uint64_t *)p_Var2;
      (__position._M_current)->_val = (uint64_t)p_Var3;
      ppEVar1 = &(__return_storage_ptr__->
                 super__Vector_base<libelfxx::ElfDynamic,_std::allocator<libelfxx::ElfDynamic>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppEVar1 = *ppEVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ElfDynamicInfo::DynamicList ElfDynamicInfo::find(uint64_t tag) const
{
  auto upper_bound = _dyns.upper_bound(tag);
  auto lower_bound = _dyns.lower_bound(tag);
  DynamicList rv;
  for (auto itr = lower_bound;itr != upper_bound;++itr) {
    rv.push_back(*itr->second);
  }
  return rv;
}